

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int constfolding(FuncState *fs,int op,expdesc *e1,expdesc *e2)

{
  int iVar1;
  bool bVar2;
  TValue res;
  TValue v2;
  TValue v1;
  
  iVar1 = tonumeral(e1,&v1);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = tonumeral(e2,&v2);
  if (iVar1 == 0) {
    return 0;
  }
  if (0xd < (uint)op) goto LAB_00106ce6;
  if ((0x2f80U >> (op & 0x1fU) & 1) == 0) {
    if ((0x68U >> (op & 0x1fU) & 1) == 0) goto LAB_00106ce6;
    if (v2.tt_ == 0x13) {
      v2.value_.n = (lua_Number)v2.value_.i;
    }
    bVar2 = v2.value_.n != 0.0;
  }
  else {
    if (v1.tt_ == 0x13) {
      res.value_ = v1.value_;
    }
    else {
      bVar2 = false;
      iVar1 = luaV_tointeger(&v1,(lua_Integer *)&res,0);
      if (iVar1 == 0) goto LAB_00106ce1;
    }
    if (v2.tt_ == 0x13) {
      bVar2 = true;
    }
    else {
      iVar1 = luaV_tointeger(&v2,(lua_Integer *)&res,0);
      bVar2 = iVar1 != 0;
    }
  }
LAB_00106ce1:
  if (!bVar2) {
    return 0;
  }
LAB_00106ce6:
  luaO_arith(fs->ls->L,op,&v1,&v2,&res);
  if (res.tt_ == 0x13) {
    e1->k = VKINT;
    e1->u = (anon_union_8_4_e6d17769_for_u)res.value_;
  }
  else {
    if (res.value_.n == 0.0) {
      return 0;
    }
    e1->k = VKFLT;
    e1->u = (anon_union_8_4_e6d17769_for_u)res.value_;
  }
  return 1;
}

Assistant:

static int constfolding (FuncState *fs, int op, expdesc *e1,
                                                const expdesc *e2) {
  TValue v1, v2, res;
  if (!tonumeral(e1, &v1) || !tonumeral(e2, &v2) || !validop(op, &v1, &v2))
    return 0;  /* non-numeric operands or not safe to fold */
  luaO_arith(fs->ls->L, op, &v1, &v2, &res);  /* does operation */
  if (ttisinteger(&res)) {
    e1->k = VKINT;
    e1->u.ival = ivalue(&res);
  }
  else {  /* folds neither NaN nor 0.0 (to avoid problems with -0.0) */
    lua_Number n = fltvalue(&res);
    if (luai_numisnan(n) || n == 0)
      return 0;
    e1->k = VKFLT;
    e1->u.nval = n;
  }
  return 1;
}